

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O0

uint32_t crc32_16bytes_prefetch
                   (void *data,size_t length,uint32_t previousCrc32,size_t prefetchAhead)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  byte *local_68;
  uint8_t *currentChar;
  uint32_t four;
  uint32_t three;
  uint32_t two;
  uint32_t one;
  size_t unrolling;
  size_t BytesAtOnce;
  size_t Unroll;
  uint32_t *current;
  uint32_t crc;
  size_t prefetchAhead_local;
  size_t sStack_18;
  uint32_t previousCrc32_local;
  size_t length_local;
  void *data_local;
  
  current._4_4_ = previousCrc32 ^ 0xffffffff;
  Unroll = (size_t)data;
  for (sStack_18 = length; prefetchAhead + 0x40 <= sStack_18; sStack_18 = sStack_18 - 0x40) {
    for (_two = 0; _two < 4; _two = _two + 1) {
      uVar4 = *(uint *)Unroll ^ current._4_4_;
      uVar1 = *(uint *)(Unroll + 4);
      puVar5 = (uint *)(Unroll + 0xc);
      uVar2 = *(uint *)(Unroll + 8);
      Unroll = Unroll + 0x10;
      uVar3 = *puVar5;
      current._4_4_ =
           Crc32Lookup[0][uVar3 >> 0x18] ^ Crc32Lookup[1][uVar3 >> 0x10 & 0xff] ^
           Crc32Lookup[2][uVar3 >> 8 & 0xff] ^ Crc32Lookup[3][uVar3 & 0xff] ^
           Crc32Lookup[4][uVar2 >> 0x18] ^ Crc32Lookup[5][uVar2 >> 0x10 & 0xff] ^
           Crc32Lookup[6][uVar2 >> 8 & 0xff] ^ Crc32Lookup[7][uVar2 & 0xff] ^
           Crc32Lookup[8][uVar1 >> 0x18] ^ Crc32Lookup[9][uVar1 >> 0x10 & 0xff] ^
           Crc32Lookup[10][uVar1 >> 8 & 0xff] ^ Crc32Lookup[0xb][uVar1 & 0xff] ^
           Crc32Lookup[0xc][uVar4 >> 0x18] ^ Crc32Lookup[0xd][uVar4 >> 0x10 & 0xff] ^
           Crc32Lookup[0xe][uVar4 >> 8 & 0xff] ^ Crc32Lookup[0xf][uVar4 & 0xff];
    }
  }
  local_68 = (byte *)Unroll;
  while (sStack_18 != 0) {
    current._4_4_ = current._4_4_ >> 8 ^ Crc32Lookup[0][current._4_4_ & 0xff ^ (uint)*local_68];
    local_68 = local_68 + 1;
    sStack_18 = sStack_18 - 1;
  }
  return current._4_4_ ^ 0xffffffff;
}

Assistant:

uint32_t crc32_16bytes_prefetch(const void* data, size_t length, uint32_t previousCrc32 = 0, size_t prefetchAhead = 256)
{
  // CRC code is identical to crc32_16bytes (including unrolling), only added prefetching
  // 256 bytes look-ahead seems to be the sweet spot on Core i7 CPUs

  uint32_t crc = ~previousCrc32; // same as previousCrc32 ^ 0xFFFFFFFF
  const uint32_t* current = (const uint32_t*) data;

  // enabling optimization (at least -O2) automatically unrolls the for-loop
  const size_t Unroll = 4;
  const size_t BytesAtOnce = 16 * Unroll;

  while (length >= BytesAtOnce + prefetchAhead)
  {
    PREFETCH(((const char*) current) + prefetchAhead);

    for (size_t unrolling = 0; unrolling < Unroll; unrolling++)
    {
#if __BYTE_ORDER == __BIG_ENDIAN
    uint32_t one   = *current++ ^ swap(crc);
    uint32_t two   = *current++;
    uint32_t three = *current++;
    uint32_t four  = *current++;
    crc  = Crc32Lookup[ 0][ four         & 0xFF] ^
           Crc32Lookup[ 1][(four  >>  8) & 0xFF] ^
           Crc32Lookup[ 2][(four  >> 16) & 0xFF] ^
           Crc32Lookup[ 3][(four  >> 24) & 0xFF] ^
           Crc32Lookup[ 4][ three        & 0xFF] ^
           Crc32Lookup[ 5][(three >>  8) & 0xFF] ^
           Crc32Lookup[ 6][(three >> 16) & 0xFF] ^
           Crc32Lookup[ 7][(three >> 24) & 0xFF] ^
           Crc32Lookup[ 8][ two          & 0xFF] ^
           Crc32Lookup[ 9][(two   >>  8) & 0xFF] ^
           Crc32Lookup[10][(two   >> 16) & 0xFF] ^
           Crc32Lookup[11][(two   >> 24) & 0xFF] ^
           Crc32Lookup[12][ one          & 0xFF] ^
           Crc32Lookup[13][(one   >>  8) & 0xFF] ^
           Crc32Lookup[14][(one   >> 16) & 0xFF] ^
           Crc32Lookup[15][(one   >> 24) & 0xFF];
#else
    uint32_t one   = *current++ ^ crc;
    uint32_t two   = *current++;
    uint32_t three = *current++;
    uint32_t four  = *current++;
    crc  = Crc32Lookup[ 0][(four  >> 24) & 0xFF] ^
           Crc32Lookup[ 1][(four  >> 16) & 0xFF] ^
           Crc32Lookup[ 2][(four  >>  8) & 0xFF] ^
           Crc32Lookup[ 3][ four         & 0xFF] ^
           Crc32Lookup[ 4][(three >> 24) & 0xFF] ^
           Crc32Lookup[ 5][(three >> 16) & 0xFF] ^
           Crc32Lookup[ 6][(three >>  8) & 0xFF] ^
           Crc32Lookup[ 7][ three        & 0xFF] ^
           Crc32Lookup[ 8][(two   >> 24) & 0xFF] ^
           Crc32Lookup[ 9][(two   >> 16) & 0xFF] ^
           Crc32Lookup[10][(two   >>  8) & 0xFF] ^
           Crc32Lookup[11][ two          & 0xFF] ^
           Crc32Lookup[12][(one   >> 24) & 0xFF] ^
           Crc32Lookup[13][(one   >> 16) & 0xFF] ^
           Crc32Lookup[14][(one   >>  8) & 0xFF] ^
           Crc32Lookup[15][ one          & 0xFF];
#endif
    }

    length -= BytesAtOnce;
  }

  const uint8_t* currentChar = (const uint8_t*) current;
  // remaining 1 to 63 bytes (standard algorithm)
  while (length-- != 0)
    crc = (crc >> 8) ^ Crc32Lookup[0][(crc & 0xFF) ^ *currentChar++];

  return ~crc; // same as crc ^ 0xFFFFFFFF
}